

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
CppGenerator::addProductToLoop
          (CppGenerator *this,ProductAggregate *prodAgg,size_t *currentLoop,bool *loopsOverRelation,
          size_t *maxDepth)

{
  vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *this_00;
  _WordT *p_Var1;
  vector<AggRegTuple,std::allocator<AggRegTuple>> *pvVar2;
  long lVar3;
  long lVar4;
  pair<unsigned_long,_unsigned_long> **pppVar5;
  long *plVar6;
  size_t sVar7;
  pointer pdVar8;
  pointer pbVar9;
  pointer pvVar10;
  iterator __position;
  pointer pmVar11;
  pointer pvVar12;
  pointer pvVar13;
  pointer pvVar14;
  unsigned_long uVar15;
  pointer pvVar16;
  pointer pAVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  _WordT _Var24;
  _WordT _Var25;
  bool bVar26;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *y;
  size_t sVar27;
  long lVar28;
  iterator iVar29;
  mapped_type *pmVar30;
  size_type sVar31;
  size_type sVar32;
  iterator iVar33;
  mapped_type *pmVar34;
  pointer puVar35;
  iterator iVar36;
  mapped_type *pmVar37;
  pointer ppVar38;
  ulong uVar39;
  pair<unsigned_long,_unsigned_long> *__args;
  ulong uVar40;
  mapped_type mVar41;
  mapped_type mVar42;
  unsigned_long *puVar43;
  iterator iVar44;
  ulong uVar45;
  _Base_ptr p_Var46;
  size_type sVar47;
  ulong uVar48;
  byte bVar49;
  pair<unsigned_long,_unsigned_long> pVar50;
  pair<unsigned_long,_unsigned_long> pVar51;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  viewReg;
  dyn_bitset viewsForThisLoop;
  size_t nextLoop;
  prod_bitset loopFunctions;
  bool local_248;
  bool local_244;
  undefined1 local_238;
  pair<unsigned_long,_unsigned_long> local_228;
  undefined1 local_1f8 [16];
  pair<unsigned_long,_unsigned_long> *local_1e8;
  size_type local_1e0;
  bool local_1d8;
  unsigned_long local_1d0;
  undefined2 uStack_1c8;
  undefined6 uStack_1c6;
  undefined2 uStack_1c0;
  undefined6 uStack_1be;
  bool bStack_1b8;
  bool bStack_1b7;
  size_t local_1b0;
  undefined2 local_1a8;
  unsigned_long local_1a0;
  _Base_ptr p_Stack_198;
  bool local_190;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  _Base_ptr local_118;
  size_type local_110;
  mapped_type local_108;
  long local_100;
  unsigned_long local_f8;
  key_type local_f0;
  
  bVar49 = 0;
  sVar7 = *currentLoop;
  y = (this->listOfLoops).
      super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + sVar7;
  pdVar8 = (this->viewsPerLoop).
           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_138.m_bits,&pdVar8[sVar7].m_bits);
  local_138.m_num_bits = pdVar8[sVar7].m_num_bits;
  sVar27 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  *loopsOverRelation =
       (local_138.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar27 >> 6] >> (sVar27 & 0x3f) & 1) != 0;
  sVar27 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  bVar18 = (byte)sVar27 & 0x3f;
  local_138.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar27 >> 6] =
       local_138.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[sVar27 >> 6] &
       (-2L << bVar18 | 0xfffffffffffffffeU >> 0x40 - bVar18);
  sVar27 = *currentLoop;
  pbVar9 = (this->functionsPerLoop).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  memcpy(&local_f0,prodAgg,0xc0);
  lVar28 = 0;
  do {
    p_Var1 = pbVar9[sVar27].super__Base_bitset<24UL>._M_w + lVar28;
    uVar19 = *(uint *)((long)p_Var1 + 4);
    _Var24 = p_Var1[1];
    uVar20 = *(uint *)((long)p_Var1 + 0xc);
    uVar21 = *(uint *)((long)local_f0.super__Base_bitset<24UL>._M_w + lVar28 * 8 + 4);
    _Var25 = local_f0.super__Base_bitset<24UL>._M_w[lVar28 + 1];
    uVar22 = *(uint *)((long)local_f0.super__Base_bitset<24UL>._M_w + lVar28 * 8 + 0xc);
    *(uint *)(local_f0.super__Base_bitset<24UL>._M_w + lVar28) =
         (uint)local_f0.super__Base_bitset<24UL>._M_w[lVar28] & (uint)*p_Var1;
    *(uint *)((long)local_f0.super__Base_bitset<24UL>._M_w + lVar28 * 8 + 4) = uVar21 & uVar19;
    *(uint *)(local_f0.super__Base_bitset<24UL>._M_w + lVar28 + 1) = (uint)_Var25 & (uint)_Var24;
    *(uint *)((long)local_f0.super__Base_bitset<24UL>._M_w + lVar28 * 8 + 0xc) = uVar22 & uVar20;
    lVar28 = lVar28 + 2;
  } while (lVar28 != 0x18);
  if (local_f0.super__Base_bitset<24UL>._M_w[0] == 0) {
    uVar48 = 0xffffffffffffffff;
    do {
      if (uVar48 == 0x16) {
        uVar40 = 0x17;
        break;
      }
      uVar40 = uVar48 + 1;
      lVar28 = uVar48 + 2;
      uVar48 = uVar40;
    } while (local_f0.super__Base_bitset<24UL>._M_w[lVar28] == 0);
    if (uVar40 < 0x17) goto LAB_00243b61;
    local_238 = 0;
    mVar42 = 0;
  }
  else {
LAB_00243b61:
    iVar29 = std::
             _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->localProductMap).
                     super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar27]._M_h,&local_f0);
    if (iVar29.super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
        ._M_cur == (__node_type *)0x0) {
      sVar27 = *currentLoop;
      pvVar10 = (this->localProductList).
                super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = *(pointer *)
                ((long)&pvVar10[sVar27].
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      lVar28 = *(long *)&pvVar10[sVar27].
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         ._M_impl.super__Vector_impl_data;
      pmVar30 = std::__detail::
                _Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)((this->localProductMap).
                                 super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + sVar27),&local_f0);
      mVar42 = ((long)pbVar9 - lVar28 >> 6) * -0x5555555555555555;
      *pmVar30 = mVar42;
      this_00 = (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                ((this->localProductList).
                 super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *currentLoop);
      __position._M_current = *(bitset<1500UL> **)(this_00 + 8);
      if (__position._M_current == *(bitset<1500UL> **)(this_00 + 0x10)) {
        local_238 = 1;
        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
        _M_realloc_insert<std::bitset<1500ul>const&>(this_00,__position,&local_f0);
      }
      else {
        memcpy(__position._M_current,&local_f0,0xc0);
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0xc0;
        local_238 = 1;
      }
    }
    else {
      mVar42 = *(mapped_type *)
                ((long)iVar29.
                       super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                       ._M_cur + 200);
      local_238 = 1;
    }
  }
  sVar47 = 0x7fffffff;
  if ((prodAgg->viewAggregate).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (prodAgg->viewAggregate).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00243d62:
    local_244 = false;
    p_Var46 = (_Base_ptr)0x7fffffff;
    local_248 = false;
  }
  else {
    sVar31 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(&local_138)
    ;
    if (sVar31 < 2) {
      sVar31 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                         (&local_138);
      if (sVar31 != 1) goto LAB_00243d62;
      sVar32 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                         (&local_138,0);
      for (ppVar38 = (prodAgg->viewAggregate).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar38 !=
          (prodAgg->viewAggregate).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar38 = ppVar38 + 1) {
        if (ppVar38->first == sVar32) {
          local_244 = true;
          p_Var46 = (_Base_ptr)ppVar38->second;
          local_248 = false;
          sVar47 = ppVar38->first;
          goto LAB_00243e70;
        }
      }
      local_244 = true;
      local_248 = false;
      p_Var46 = (_Base_ptr)0x7fffffff;
    }
    else {
      local_1f8._0_8_ = (pointer)0x0;
      local_1f8._8_8_ = (pair<unsigned_long,_unsigned_long> *)0x0;
      local_1e8 = (pair<unsigned_long,_unsigned_long> *)0x0;
      sVar47 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                         (&local_138,0);
      for (; sVar47 != 0xffffffffffffffff;
          sVar47 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                             ((this->viewsPerLoop).
                              super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + *currentLoop,sVar47)) {
        for (__args = (prodAgg->viewAggregate).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            __args != (prodAgg->viewAggregate).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
          if (__args->first == sVar47) {
            if ((pair<unsigned_long,_unsigned_long> *)local_1f8._8_8_ == local_1e8) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)local_1f8,(iterator)local_1f8._8_8_,__args);
            }
            else {
              uVar15 = __args->second;
              *(unsigned_long *)local_1f8._8_8_ = __args->first;
              *(unsigned_long *)(local_1f8._8_8_ + 8) = uVar15;
              local_1f8._8_8_ = local_1f8._8_8_ + 0x10;
            }
            break;
          }
        }
      }
      iVar33 = std::
               _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
               ::find(&(this->viewProductMap).
                       super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[*currentLoop]._M_t,
                      (key_type *)local_1f8);
      sVar47 = *currentLoop;
      pmVar11 = (this->viewProductMap).
                super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (iVar33._M_node == &pmVar11[sVar47]._M_t._M_impl.super__Rb_tree_header._M_header) {
        pvVar12 = (this->viewProductList).
                  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar28 = *(long *)&pvVar12[sVar47].
                           super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        pvVar13 = *(pointer *)
                   ((long)&pvVar12[sVar47].
                           super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data + 8);
        pmVar34 = std::
                  map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
                  ::operator[](pmVar11 + sVar47,(key_type *)local_1f8);
        p_Var46 = (_Base_ptr)(((long)pvVar13 - lVar28 >> 3) * -0x5555555555555555);
        *pmVar34 = (mapped_type)p_Var46;
        sVar47 = *currentLoop;
        std::
        vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
        ::push_back((this->viewProductList).
                    super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + sVar47,(value_type *)local_1f8);
      }
      else {
        p_Var46 = iVar33._M_node[1]._M_right;
      }
      if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1f8._0_8_);
      }
      local_248 = true;
      local_244 = false;
    }
  }
LAB_00243e70:
  pvVar14 = (this->nextLoopsPerLoop).
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_228.first =
       (long)(this->listOfLoops).
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->listOfLoops).
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  puVar35 = pvVar14[sVar7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_118 = p_Var46;
  local_110 = sVar47;
  local_108 = mVar42;
  if (*(pointer *)
       ((long)&pvVar14[sVar7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data + 8) == puVar35) {
    pVar50.second = 0;
    pVar50.first = local_228.first;
  }
  else {
    uVar48 = 0;
    local_228.second = 0;
    do {
      uVar15 = puVar35[uVar48];
      local_f8 = uVar15;
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8,
                       (this->listOfLoops).
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar15,y);
      bVar26 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_1f8,y);
      if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if (!bVar26) {
        std::operator<<((ostream *)&std::cerr,"There is a problem with nextLoopsPerLoop\n");
        exit(1);
      }
      local_100 = uVar15 * 3;
      memcpy(local_1f8,
             (this->functionsPerLoopBranch).
             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
             super__Vector_impl_data._M_start + uVar15,0xc0);
      lVar28 = 0;
      do {
        p_Var1 = (prodAgg->product).super__Base_bitset<24UL>._M_w + lVar28;
        uVar19 = *(uint *)((long)p_Var1 + 4);
        _Var24 = p_Var1[1];
        uVar20 = *(uint *)((long)p_Var1 + 0xc);
        lVar3 = lVar28 * 8;
        uVar21 = *(uint *)(local_1f8 + lVar3 + 4);
        uVar22 = *(uint *)(local_1f8 + lVar3 + 8);
        uVar23 = *(uint *)(local_1f8 + lVar3 + 0xc);
        lVar4 = lVar28 * 8;
        *(uint *)(local_1f8 + lVar4) = *(uint *)(local_1f8 + lVar3) & (uint)*p_Var1;
        *(uint *)(local_1f8 + lVar4 + 4) = uVar21 & uVar19;
        *(uint *)(local_1f8 + lVar4 + 8) = uVar22 & (uint)_Var24;
        *(uint *)(local_1f8 + lVar4 + 0xc) = uVar23 & uVar20;
        lVar28 = lVar28 + 2;
      } while (lVar28 != 0x18);
      if ((pointer)local_1f8._0_8_ == (pointer)0x0) {
        uVar40 = 0xffffffffffffffff;
        do {
          if (uVar40 == 0x16) {
            uVar39 = 0x17;
            break;
          }
          uVar39 = uVar40 + 1;
          pppVar5 = &local_1e8 + uVar40;
          uVar40 = uVar39;
        } while (*pppVar5 == (pair<unsigned_long,_unsigned_long> *)0x0);
        pVar50 = local_228;
        if (uVar39 < 0x17) goto LAB_00243fad;
      }
      else {
LAB_00243fad:
        pVar50 = addProductToLoop(this,prodAgg,&local_f8,loopsOverRelation,maxDepth);
        pvVar14 = (this->nextLoopsPerLoop).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar28 = *(long *)&pvVar14[sVar7].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data;
        if (uVar48 + 1 !=
            (long)*(pointer *)
                   ((long)&pvVar14[sVar7].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8) - lVar28 >> 3) {
          memcpy(local_1f8,
                 (this->functionsPerLoopBranch).
                 super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + *(long *)(lVar28 + 8 + uVar48 * 8),0xc0)
          ;
          lVar28 = 0;
          do {
            p_Var1 = (prodAgg->product).super__Base_bitset<24UL>._M_w + lVar28;
            uVar19 = *(uint *)((long)p_Var1 + 4);
            _Var24 = p_Var1[1];
            uVar20 = *(uint *)((long)p_Var1 + 0xc);
            lVar3 = lVar28 * 8;
            uVar21 = *(uint *)(local_1f8 + lVar3 + 4);
            uVar22 = *(uint *)(local_1f8 + lVar3 + 8);
            uVar23 = *(uint *)(local_1f8 + lVar3 + 0xc);
            lVar4 = lVar28 * 8;
            *(uint *)(local_1f8 + lVar4) = *(uint *)(local_1f8 + lVar3) & (uint)*p_Var1;
            *(uint *)(local_1f8 + lVar4 + 4) = uVar21 & uVar19;
            *(uint *)(local_1f8 + lVar4 + 8) = uVar22 & (uint)_Var24;
            *(uint *)(local_1f8 + lVar4 + 0xc) = uVar23 & uVar20;
            lVar28 = lVar28 + 2;
          } while (lVar28 != 0x18);
          if ((pointer)local_1f8._0_8_ == (pointer)0x0) {
            uVar40 = 0xffffffffffffffff;
            do {
              if (uVar40 == 0x16) {
                uVar39 = 0x17;
                break;
              }
              uVar39 = uVar40 + 1;
              pppVar5 = &local_1e8 + uVar40;
              uVar40 = uVar39;
            } while (*pppVar5 == (pair<unsigned_long,_unsigned_long> *)0x0);
            if (0x16 < uVar39) goto LAB_002441b8;
          }
          local_1e0 = 0;
          local_1d8 = false;
          local_1e8 = (pair<unsigned_long,_unsigned_long> *)((ulong)local_1e8 & 0xffffffffffffff00);
          bStack_1b7 = false;
          local_1d0 = 0;
          local_1b0 = 100;
          local_1a8._0_1_ = false;
          local_1a8._1_1_ = false;
          local_190 = false;
          local_1a0 = 0;
          p_Stack_198 = (_Base_ptr)0x0;
          bStack_1b8 = true;
          local_1f8._0_8_ = local_228.first;
          local_1f8._8_8_ = local_228.second;
          uStack_1c8 = (undefined2)pVar50.first;
          uStack_1c6 = pVar50.first._2_6_;
          uStack_1c0 = (undefined2)pVar50.second;
          uStack_1be = pVar50.second._2_6_;
          iVar36 = std::
                   _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->aggregateRegisterMap).
                           super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_h,
                          (key_type *)local_1f8);
          lVar28 = local_100;
          if (iVar36.super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>.
              _M_cur == (__node_type *)0x0) {
            pvVar16 = (this->newAggregateRegister).
                      super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar3 = *(long *)((long)&(pvVar16->
                                     super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                                     _M_impl.super__Vector_impl_data + local_100 * 8 + 8);
            lVar4 = *(long *)((long)&(pvVar16->
                                     super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                                     _M_impl.super__Vector_impl_data + local_100 * 8);
            pmVar37 = std::__detail::
                      _Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)((this->aggregateRegisterMap).
                                       super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar15),
                                   (key_type *)local_1f8);
            mVar41 = (lVar3 - lVar4 >> 4) * 0x6db6db6db6db6db7;
            *pmVar37 = mVar41;
            pvVar2 = (vector<AggRegTuple,std::allocator<AggRegTuple>> *)
                     ((long)&(((this->newAggregateRegister).
                               super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>)._M_impl.
                             super__Vector_impl_data + lVar28 * 8);
            iVar44._M_current = *(AggRegTuple **)(pvVar2 + 8);
            if (iVar44._M_current == *(AggRegTuple **)(pvVar2 + 0x10)) {
              std::vector<AggRegTuple,std::allocator<AggRegTuple>>::
              _M_realloc_insert<AggRegTuple_const&>(pvVar2,iVar44,(AggRegTuple *)local_1f8);
            }
            else {
              puVar43 = (unsigned_long *)local_1f8;
              for (lVar28 = 0xe; lVar28 != 0; lVar28 = lVar28 + -1) {
                ((iVar44._M_current)->previous).first = *puVar43;
                puVar43 = puVar43 + (ulong)bVar49 * -2 + 1;
                iVar44._M_current = iVar44._M_current + (ulong)bVar49 * -0x10 + 8;
              }
              *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 0x70;
            }
          }
          else {
            mVar41 = *(mapped_type *)
                      ((long)iVar36.
                             super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>
                             ._M_cur + 0x78);
          }
          pVar50.second = mVar41;
          pVar50.first = uVar15;
        }
      }
LAB_002441b8:
      uVar48 = uVar48 + 1;
      pvVar14 = (this->nextLoopsPerLoop).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar35 = pvVar14[sVar7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_228 = pVar50;
    } while (uVar48 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar14[sVar7].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + 8) - (long)puVar35
                             >> 3));
  }
  local_1d8 = false;
  bStack_1b8 = false;
  bStack_1b7 = false;
  local_1d0 = 0;
  local_1b0 = 100;
  local_1e8 = (pair<unsigned_long,_unsigned_long> *)CONCAT71(local_1e8._1_7_,local_238);
  local_1e0 = local_108;
  local_1a0 = local_110;
  p_Stack_198 = local_118;
  local_1a8._1_1_ = local_244;
  local_1a8._0_1_ = local_248;
  uStack_1c8 = (undefined2)pVar50.first;
  uStack_1c6 = pVar50.first._2_6_;
  uStack_1c0 = (undefined2)pVar50.second;
  uStack_1be = pVar50.second._2_6_;
  local_1f8._0_8_ =
       (long)(this->listOfLoops).
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->listOfLoops).
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_1f8._8_8_ = (pointer)0x0;
  local_190 = false;
  puVar35 = (y->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar28 = (long)(y->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar35;
  bVar26 = lVar28 != 0;
  if (bVar26) {
    uVar48 = lVar28 >> 3;
    uVar40 = uVar48 + (uVar48 == 0);
    if (*puVar35 != 0) goto LAB_0024436f;
    uVar39 = 0;
    do {
      uVar45 = uVar40;
      if (uVar40 - 1 == uVar39) break;
      uVar45 = uVar39 + 1;
      lVar28 = uVar39 + 1;
      uVar39 = uVar45;
    } while (puVar35[lVar28] == 0);
    bVar26 = uVar45 < uVar48;
  }
  if (!bVar26) {
    uVar48 = (prodAgg->previous).first;
    if (uVar48 < *maxDepth) {
      plVar6 = (long *)(*(long *)&(this->productToVariableRegister).
                                  super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar48].
                                  super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                                  ._M_impl.super__Vector_impl_data + 0xe8 +
                       (prodAgg->previous).second * 0x100);
      local_1f8._0_8_ = *plVar6;
      local_1f8._8_8_ = plVar6[1];
      local_1b0 = uVar48;
    }
    if ((*loopsOverRelation == false) && (prodAgg->multiplyByCount == true)) {
      local_190 = true;
    }
  }
LAB_0024436f:
  iVar36 = std::
           _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->aggregateRegisterMap).
                   super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar7]._M_h,(key_type *)local_1f8);
  if (iVar36.super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>._M_cur ==
      (__node_type *)0x0) {
    pvVar16 = (this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar17 = *(pointer *)
               ((long)&pvVar16[sVar7].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                       _M_impl.super__Vector_impl_data + 8);
    lVar28 = *(long *)&pvVar16[sVar7].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                       _M_impl.super__Vector_impl_data;
    pmVar37 = std::__detail::
              _Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)((this->aggregateRegisterMap).
                               super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sVar7),
                           (key_type *)local_1f8);
    mVar41 = ((long)pAVar17 - lVar28 >> 4) * 0x6db6db6db6db6db7;
    *pmVar37 = mVar41;
    pvVar2 = (vector<AggRegTuple,std::allocator<AggRegTuple>> *)
             ((this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + sVar7);
    iVar44._M_current = *(AggRegTuple **)(pvVar2 + 8);
    if (iVar44._M_current == *(AggRegTuple **)(pvVar2 + 0x10)) {
      std::vector<AggRegTuple,std::allocator<AggRegTuple>>::_M_realloc_insert<AggRegTuple_const&>
                (pvVar2,iVar44,(AggRegTuple *)local_1f8);
    }
    else {
      puVar43 = (unsigned_long *)local_1f8;
      for (lVar28 = 0xe; lVar28 != 0; lVar28 = lVar28 + -1) {
        ((iVar44._M_current)->previous).first = *puVar43;
        puVar43 = puVar43 + (ulong)bVar49 * -2 + 1;
        iVar44._M_current = iVar44._M_current + (ulong)bVar49 * -0x10 + 8;
      }
      *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 0x70;
    }
  }
  else {
    mVar41 = *(mapped_type *)
              ((long)iVar36.
                     super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>.
                     _M_cur + 0x78);
  }
  if (local_138.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pVar51.second = mVar41;
  pVar51.first = sVar7;
  return pVar51;
}

Assistant:

std::pair<size_t,size_t> CppGenerator::addProductToLoop(
    ProductAggregate& prodAgg, size_t& currentLoop, bool& loopsOverRelation,
    const size_t& maxDepth)
{
    const size_t thisLoopID = currentLoop;
    const dyn_bitset& thisLoop = listOfLoops[currentLoop];

    dyn_bitset viewsForThisLoop = viewsPerLoop[currentLoop];
    loopsOverRelation = viewsForThisLoop[_qc->numberOfViews()];
    
    viewsForThisLoop.reset(_qc->numberOfViews());
 
    std::pair<bool,size_t> regTupleProduct = {false,0};  

    // check if this product requires computation over this loop loopmask
    prod_bitset loopFunctions = prodAgg.product & functionsPerLoop[currentLoop];
    if (loopFunctions.any())
    {
        // This should be add to the loop not depth 
        auto proditerator = localProductMap[currentLoop].find(loopFunctions);
        if (proditerator != localProductMap[currentLoop].end())
        {
            // set this local product to the id given by the map
            regTupleProduct = {true, proditerator->second};
        }
        else
        {
            size_t nextID = localProductList[currentLoop].size();
            localProductMap[currentLoop][loopFunctions] = nextID;
            regTupleProduct = {true, nextID};
            localProductList[currentLoop].push_back(loopFunctions);
        }
    }

    bool newViewProduct = false;
    bool singleViewAgg = false;
    
    std::pair<size_t, size_t> regTupleView = {2147483647,2147483647};

    if (!prodAgg.viewAggregate.empty())
    {
        if (viewsForThisLoop.count() > 1)
        {
            newViewProduct = true;
       
            std::vector<std::pair<size_t, size_t>> viewReg;

            size_t viewID = viewsForThisLoop.find_first();
            while (viewID != boost::dynamic_bitset<>::npos)
            {
                for (const std::pair<size_t, size_t>& viewAgg : prodAgg.viewAggregate)
                {
                    if (viewAgg.first == viewID)
                    {
                        viewReg.push_back(viewAgg);
                        break;
                    }
                }

                viewID = viewsPerLoop[currentLoop].find_next(viewID);
            }
            auto viewit = viewProductMap[currentLoop].find(viewReg);
            if (viewit != viewProductMap[currentLoop].end())
            {
                // set this local product to the id given by the map
                regTupleView = {currentLoop, viewit->second};            
            }
            else
            {
                size_t nextID =  viewProductList[currentLoop].size();
                viewProductMap[currentLoop][viewReg] = nextID;
                regTupleView = {currentLoop, nextID};
                viewProductList[currentLoop].push_back(viewReg);
            }
        }
        else if (viewsForThisLoop.count() == 1)
        {
            // Inside a loop there would only be a single view agg, so we could avoid
            // explicitly materializing the view Agg and simply multiply directly with
            // the aggregate from the view - this could be captured in the aggregate
            // computation that captures both the local aggregate and the view Agg
            singleViewAgg = true;
        
            // reuse the simple aggregate from the corresponding view
            size_t viewID = viewsForThisLoop.find_first();

            for (const std::pair<size_t, size_t>& viewAgg : prodAgg.viewAggregate)
            {
                if (viewAgg.first == viewID)
                {
                    regTupleView = viewAgg;
                    break;
                }
            }

            /*************** PRINT OUT **************/
            // if (regTupleView.first == 2)
            // {
            //     std::cout << "################## " <<
            //         regTupleView.first << "  " << regTupleView.second << std::endl;
            // }
            /*************** PRINT OUT **************/

        }
    }
    
    
    std::pair<size_t,size_t> previousComputation = {listOfLoops.size(),0};
    
    for (size_t next=0; next < nextLoopsPerLoop[thisLoopID].size(); ++next)
    {
        size_t nextLoop = nextLoopsPerLoop[thisLoopID][next];

        if (((listOfLoops[nextLoop] & thisLoop) != thisLoop))
        {
            ERROR("There is a problem with nextLoopsPerLoop\n");
            exit(1);
        }
        
        if ((functionsPerLoopBranch[nextLoop] & prodAgg.product).any())
        {
            std::pair<size_t, size_t> postComputation =
                addProductToLoop(prodAgg, nextLoop, loopsOverRelation, maxDepth);
            
            if (next + 1 != nextLoopsPerLoop[thisLoopID].size() &&
                (functionsPerLoopBranch[nextLoopsPerLoop[thisLoopID][next+1]]&
                 prodAgg.product).any())
            {
                // Add this product to this loop with the 'prev'Computation
                AggRegTuple postRegTuple;
                postRegTuple.postLoopAgg = true;
                postRegTuple.previous = previousComputation; 
                postRegTuple.postLoop = postComputation;
                
                // TODO: add the aggregate to the register!!
                auto regit = aggregateRegisterMap[nextLoop].find(postRegTuple);
                if (regit != aggregateRegisterMap[nextLoop].end())
                {
                    previousComputation = {nextLoop,regit->second};
                }
                else
                {
                    // If so, add it to the aggregate register
                    size_t newID = newAggregateRegister[nextLoop].size();
                    aggregateRegisterMap[nextLoop][postRegTuple] = newID;
                    newAggregateRegister[nextLoop].push_back(postRegTuple);
                    
                    previousComputation =  {nextLoop,newID};
                }
            }
            else
            {
                previousComputation = postComputation;
            }
            
        }
    }
    
    // while(currentLoop < listOfLoops.size()-1)
    // {
    //     currentLoop++;
    //     if (((listOfLoops[currentLoop] & thisLoop) == thisLoop))
    //     {
    //         if ((functionsPerLoopBranch[currentLoop] & prodAgg.product).any())
    //         {
    //             std::pair<size_t, size_t> postComputation =
    //                 addProductToLoop(prodAgg,currentLoop,loopsOverRelation,maxDepth);
    //             /**************** PRINT OUT ******************/
    //             // std::cout << "HERE \n";
    //             // std::cout << listOfLoops[currentLoop] <<"  "<<thisLoop<<std::endl;
    //             /**************** PRINT OUT ******************/
    //             // Add this product to this loop with the 'prev'Computation
    //             AggRegTuple postRegTuple;
    //             postRegTuple.postLoopAgg = true;
    //             postRegTuple.localAgg = previousComputation; // TODO:TODO:TODO:
    //             postRegTuple.postLoop = postComputation;
    //             // TODO: add the aggregate to the register!!
    //             auto regit = aggregateRegisterMap[currentLoop].find(postRegTuple);
    //             if (regit != aggregateRegisterMap[currentLoop].end())
    //                 previousComputation = {currentLoop,regit->second};
    //             else
    //             {
    //                 // If so, add it to the aggregate register
    //                 size_t newID = newAggregateRegister[currentLoop].size();
    //                 aggregateRegisterMap[currentLoop][postRegTuple] = newID;
    //                 newAggregateRegister[currentLoop].push_back(postRegTuple); 
    //                 previousComputation =  {currentLoop,newID};;
    //             }
    //         }
    //     }
    //     else break;
    // }

    // Check if this product has already been computed, if not we add it to the list
    AggRegTuple regTuple;
    regTuple.product = regTupleProduct;
    regTuple.viewAgg = regTupleView;

    /********* PRINT OUT ********/
    // if (regTupleView.first == 2)
    // {
    //     std::cout << "###########/>>>>>>>>> " <<
    //         regTuple.viewAgg.first << "  " << regTuple.viewAgg.second << std::endl;
    // }
    /********* PRINT OUT ********/
           
    regTuple.newViewProduct = newViewProduct;
    regTuple.singleViewAgg = singleViewAgg;
    regTuple.postLoop = previousComputation;

    regTuple.previous = {listOfLoops.size(),0};
    regTuple.multiplyByCount = false;
    
    // Multiply by previous #computation -- if needed
    if (thisLoop.none())
    {
        if (prodAgg.previous.first < maxDepth)
        {            
            const ProductAggregate& prevProdAgg =
                productToVariableRegister[prodAgg.previous.first]
                [prodAgg.previous.second];
            regTuple.previous = prevProdAgg.correspondingLoopAgg;
            regTuple.prevDepth = prodAgg.previous.first;
        }
        // Mutliply by count if needed
        if (!loopsOverRelation && prodAgg.multiplyByCount)
            regTuple.multiplyByCount = true;
    }

    auto regit = aggregateRegisterMap[thisLoopID].find(regTuple);
    if (regit != aggregateRegisterMap[thisLoopID].end())
    {
        previousComputation = {thisLoopID,regit->second};
    }
    else
    {
        // If so, add it to the aggregate register
        size_t newID = newAggregateRegister[thisLoopID].size();
        aggregateRegisterMap[thisLoopID][regTuple] = newID;
        newAggregateRegister[thisLoopID].push_back(regTuple);
        
        previousComputation =  {thisLoopID,newID};
    }

    return previousComputation;
}